

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

KeyID __thiscall
anon_unknown.dwarf_4088d4::BuildEngineImpl::getKeyID(BuildEngineImpl *this,KeyType *key)

{
  StringRef Key;
  pair<llvm::StringMapIterator<llbuild::core::KeyID>,_bool> pVar1;
  KeyID local_68;
  char *local_60;
  size_t local_58;
  KeyID local_50;
  char *local_48;
  size_t local_40;
  undefined8 local_28;
  
  std::mutex::lock(&this->keyTableMutex);
  std::__cxx11::string::string((string *)&local_48,(string *)key);
  local_28 = 0;
  Key.Length = local_40;
  Key.Data = local_48;
  local_60 = local_48;
  local_58 = local_40;
  local_50._value = 0;
  pVar1 = llvm::StringMap<llbuild::core::KeyID,_llvm::MallocAllocator>::
          try_emplace<llbuild::core::KeyID>(&this->keyTable,Key,&local_50);
  std::__cxx11::string::_M_dispose();
  llbuild::core::KeyID::KeyID
            (&local_68,
             (void *)(*(long *)pVar1.first.
                               super_StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
                               .Ptr.
                               super_StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
                     + 0x10));
  pthread_mutex_unlock((pthread_mutex_t *)&this->keyTableMutex);
  return (KeyID)local_68._value;
}

Assistant:

virtual const KeyID getKeyID(const KeyType& key) override {
    std::lock_guard<std::mutex> guard(keyTableMutex);

    // The RHS of the mapping is actually ignored, we use the StringMap's ptr
    // identity because it allows us to efficiently map back to the key string
    // in `getRuleInfoForKey`.
    auto it = keyTable.insert(std::make_pair(key.str(), KeyID::novalue())).first;
    return KeyID(it->getKey().data());
  }